

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make-unique.h
# Opt level: O2

unique_ptr<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>_> __thiscall
wabt::MakeUnique<wabt::GlobalModuleField,wabt::Location>(wabt *this,Location *args)

{
  GlobalModuleField *this_00;
  
  this_00 = (GlobalModuleField *)operator_new(0x80);
  GlobalModuleField::GlobalModuleField(this_00,args,(string_view)ZEXT816(0));
  *(GlobalModuleField **)this = this_00;
  return (__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
          )(__uniq_ptr_data<wabt::GlobalModuleField,_std::default_delete<wabt::GlobalModuleField>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}